

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall QGraphicsScene::destroyItemGroup(QGraphicsScene *this,QGraphicsItemGroup *group)

{
  long lVar1;
  bool bVar2;
  const_iterator o;
  long *in_RSI;
  QList<QGraphicsItem_*> *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem *item;
  QList<QGraphicsItem_*> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QGraphicsItem_*> items;
  QGraphicsItem *in_stack_ffffffffffffffa8;
  const_iterator this_00;
  const_iterator local_28;
  undefined1 *local_20;
  QGraphicsItem *item_00;
  QGraphicsItemGroup *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  item_00 = (QGraphicsItem *)&DAT_aaaaaaaaaaaaaaaa;
  this_01 = (QGraphicsItemGroup *)&DAT_aaaaaaaaaaaaaaaa;
  QGraphicsItem::childItems(in_stack_ffffffffffffffa8);
  local_28.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = QList<QGraphicsItem_*>::begin(in_RDI);
  o = QList<QGraphicsItem_*>::end(in_RDI);
  while( true ) {
    this_00.i = o.i;
    bVar2 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_28,o);
    if (!bVar2) break;
    QList<QGraphicsItem_*>::const_iterator::operator*(&local_28);
    QGraphicsItemGroup::removeFromGroup(this_01,item_00);
    QList<QGraphicsItem_*>::const_iterator::operator++(&local_28);
    o.i = this_00.i;
  }
  removeItem((QGraphicsScene *)this_00.i,(QGraphicsItem *)o.i);
  if (in_RSI != (long *)0x0) {
    (**(code **)(*in_RSI + 8))();
  }
  QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0x9cc45a);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::destroyItemGroup(QGraphicsItemGroup *group)
{
    const auto items = group->childItems();
    for (QGraphicsItem *item : items)
        group->removeFromGroup(item);
    removeItem(group);
    delete group;
}